

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O0

void __thiscall
Js::InterpreterStackFrame::
OP_SetLocalProperty<Js::OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)2>>const__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout)

{
  OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout_local;
  InterpreterStackFrame *this_local;
  
  DoSetProperty<Js::OpLayoutT_ElementP<Js::LayoutSizePolicy<(Js::LayoutSize)2>>const__unaligned>
            (this,playout,*(Var *)(this + 0x58),PropertyOperation_None);
  return;
}

Assistant:

void InterpreterStackFrame::OP_SetLocalProperty(unaligned T* playout)
    {
        DoSetProperty(playout, this->localClosure, PropertyOperation_None);
    }